

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupWithNewPo(Gia_Man_t *p1,Gia_Man_t *p2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  
  if (p2->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x91e,"Gia_Man_t *Gia_ManDupWithNewPo(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p2->vCis->nSize != p1->nRegs) {
    __assert_fail("Gia_ManPiNum(p2) == Gia_ManRegNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x922,"Gia_Man_t *Gia_ManDupWithNewPo(Gia_Man_t *, Gia_Man_t *)");
  }
  p = Gia_ManStart(p2->nObjs + p1->nObjs);
  pcVar4 = Abc_UtilStrsav(p1->pName);
  p->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p1->pSpec);
  p->pSpec = pcVar4;
  Gia_ManHashAlloc(p);
  p1->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < p1->vCis->nSize; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCi(p1,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p);
    pGVar5->Value = uVar1;
  }
  for (iVar8 = 0; iVar8 < p1->nObjs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManObj(p1,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p,iVar2,iVar3);
      pGVar5->Value = uVar1;
    }
  }
  p2->pObjs->Value = 0;
  for (iVar8 = 0; iVar8 < p2->vCis->nSize - p2->nRegs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCi(p2,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    pGVar6 = Gia_ManRo(p1,iVar8);
    pGVar5->Value = pGVar6->Value;
  }
  for (iVar8 = 0; iVar8 < p2->nObjs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManObj(p2,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p,iVar2,iVar3);
      pGVar5->Value = uVar1;
    }
  }
  for (iVar8 = 0; iVar8 < p2->vCos->nSize - p2->nRegs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCo(p2,iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    Gia_ManAppendCo(p,iVar2);
  }
  for (iVar8 = 0; iVar8 < p1->nRegs; iVar8 = iVar8 + 1) {
    pGVar5 = Gia_ManCo(p1,(p1->vCos->nSize - p1->nRegs) + iVar8);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    Gia_ManAppendCo(p,iVar2);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,p1->nRegs);
  pGVar7 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManDupWithNewPo( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    Gia_Man_t * pTemp, * pNew;
    Gia_Obj_t * pObj;
    int i;
    // there is no flops in p2
    assert( Gia_ManRegNum(p2) == 0 );
    // there is only one PO in p2
//    assert( Gia_ManPoNum(p2) == 1 );
    // input count of p2 is equal to flop count of p1 
    assert( Gia_ManPiNum(p2) == Gia_ManRegNum(p1) );

    // start new AIG
    pNew = Gia_ManStart( Gia_ManObjNum(p1)+Gia_ManObjNum(p2) );
    pNew->pName = Abc_UtilStrsav( p1->pName );
    pNew->pSpec = Abc_UtilStrsav( p1->pSpec );
    Gia_ManHashAlloc( pNew );
    // dup first AIG
    Gia_ManConst0(p1)->Value = 0;
    Gia_ManForEachCi( p1, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p1, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // dup second AIG
    Gia_ManConst0(p2)->Value = 0;
    Gia_ManForEachPi( p2, pObj, i )
        pObj->Value = Gia_ManRo(p1, i)->Value;
    Gia_ManForEachAnd( p2, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // add property output
    Gia_ManForEachPo( p2, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // add flop inputs
    Gia_ManForEachRi( p1, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p1) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}